

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlmvn.cc
# Opt level: O0

void __thiscall klogic::mlmvn_forward_base::start(mlmvn_forward_base *this,cvector *X,iterator _out)

{
  size_t sVar1;
  size_type sVar2;
  cvector *X_local;
  mlmvn_forward_base *this_local;
  iterator _out_local;
  
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
            (&this->layer1,(long)this->net->max_layer_size);
  sVar1 = mlmvn::layers_count(this->net);
  if (1 < sVar1) {
    sVar2 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::size
                      (&this->layer1);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
              (&this->layer2,sVar2);
  }
  this->from = X;
  this->to = &this->layer1;
  sVar2 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::size(X);
  this->from_size = sVar2;
  (this->out)._M_current = _out._M_current;
  this->use_out = true;
  this->layer = 0;
  return;
}

Assistant:

void klogic::mlmvn_forward_base::start(const klogic::cvector &X, cvector::iterator _out)
{
    layer1.resize(net.max_layer_size);

    // Allocate memory for 1 or 2 layers
    if (net.layers_count() > 1)
        layer2.resize(layer1.size());

    from = &X;
    to = &layer1;
    from_size = X.size();

    out = _out;
    use_out = true;
    layer = 0;
}